

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O3

mat4 * __thiscall lumeview::Camera::view_matrix(mat4 *__return_storage_ptr__,Camera *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  vec3 vVar15;
  
  vVar15 = forward(this);
  fVar6 = (this->m_trans).field_0.field_0.z;
  fVar8 = fVar6 - vVar15.field_0._8_4_ * (this->m_scale).field_0.field_0.z;
  uVar1 = *(undefined8 *)&(this->m_scale).field_0;
  uVar2 = *(undefined8 *)&(this->m_trans).field_0;
  fVar9 = (float)uVar2;
  fVar11 = (float)((ulong)uVar2 >> 0x20);
  fVar6 = fVar6 - fVar8;
  fVar3 = fVar9 - (float)uVar1 * vVar15.field_0._0_4_;
  fVar4 = fVar11 - (float)((ulong)uVar1 >> 0x20) * vVar15.field_0._4_4_;
  vVar15 = up(this);
  fVar9 = fVar9 - fVar3;
  fVar11 = fVar11 - fVar4;
  fVar7 = 1.0 / SQRT(fVar11 * fVar11 + fVar9 * fVar9 + fVar6 * fVar6);
  fVar6 = fVar6 * fVar7;
  fVar9 = fVar7 * fVar9;
  fVar7 = fVar7 * fVar11;
  fVar13 = fVar6 * vVar15.field_0._0_4_ - fVar9 * vVar15.field_0._8_4_;
  fVar11 = vVar15.field_0._4_4_ * fVar9 - fVar7 * vVar15.field_0._0_4_;
  fVar5 = vVar15.field_0._8_4_ * fVar7 - fVar6 * vVar15.field_0._4_4_;
  fVar10 = 1.0 / SQRT(fVar5 * fVar5 + fVar13 * fVar13 + fVar11 * fVar11);
  fVar5 = fVar5 * fVar10;
  fVar13 = fVar13 * fVar10;
  fVar10 = fVar10 * fVar11;
  fVar11 = fVar13 * fVar6 - fVar10 * fVar7;
  fVar14 = fVar10 * fVar9 - fVar5 * fVar6;
  __return_storage_ptr__->value[0].field_0.field_0.w = 0.0;
  __return_storage_ptr__->value[1].field_0.field_0.w = 0.0;
  __return_storage_ptr__->value[2].field_0.field_0.w = 0.0;
  __return_storage_ptr__->value[3].field_0.field_0.w = 1.0;
  __return_storage_ptr__->value[0].field_0.field_0.x = fVar5;
  __return_storage_ptr__->value[1].field_0.field_0.x = fVar13;
  __return_storage_ptr__->value[2].field_0.field_0.x = fVar10;
  __return_storage_ptr__->value[0].field_0.field_0.y = fVar11;
  fVar12 = fVar7 * fVar5 - fVar13 * fVar9;
  __return_storage_ptr__->value[1].field_0.field_0.y = fVar14;
  __return_storage_ptr__->value[2].field_0.field_0.y = fVar12;
  __return_storage_ptr__->value[0].field_0.field_0.z = -fVar9;
  __return_storage_ptr__->value[1].field_0.field_0.z = -fVar7;
  __return_storage_ptr__->value[2].field_0.field_0.z = -fVar6;
  *(ulong *)&__return_storage_ptr__->value[3].field_0 =
       CONCAT44(fVar12 * fVar8 + fVar4 * fVar14 + fVar11 * fVar3,
                fVar10 * fVar8 + fVar3 * fVar5 + fVar13 * fVar4) ^ 0x8000000080000000;
  __return_storage_ptr__->value[3].field_0.field_0.z = fVar7 * fVar4 + fVar9 * fVar3 + fVar6 * fVar8
  ;
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 Camera::
view_matrix () const
{
	return glm::lookAt (from(), to(), up());
}